

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

AArch64_AM_ShiftExtendType AArch64_AM_getShiftType(uint Imm)

{
  AArch64_AM_ShiftExtendType local_c;
  uint Imm_local;
  
  switch(Imm >> 6 & 7) {
  case 0:
    local_c = AArch64_AM_LSL;
    break;
  case 1:
    local_c = AArch64_AM_LSR;
    break;
  case 2:
    local_c = AArch64_AM_ASR;
    break;
  case 3:
    local_c = AArch64_AM_ROR;
    break;
  case 4:
    local_c = AArch64_AM_MSL;
    break;
  default:
    local_c = AArch64_AM_InvalidShiftExtend;
  }
  return local_c;
}

Assistant:

static inline AArch64_AM_ShiftExtendType AArch64_AM_getShiftType(unsigned Imm)
{
	switch ((Imm >> 6) & 0x7) {
		default: return AArch64_AM_InvalidShiftExtend;
		case 0: return AArch64_AM_LSL;
		case 1: return AArch64_AM_LSR;
		case 2: return AArch64_AM_ASR;
		case 3: return AArch64_AM_ROR;
		case 4: return AArch64_AM_MSL;
	}
}